

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomSlots::write(DomSlots *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar1;
  QString *v_1;
  long lVar2;
  QString *pQVar3;
  QString *v;
  long in_FS_OFFSET;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  aVar1._4_4_ = in_register_00000034;
  aVar1._0_4_ = __fd;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)((long)__buf + 0x10);
  if (lVar2 == 0) {
    local_50.d = (Data *)0x0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_68.size = 0;
    local_50.ptr = L"slots";
    local_50.size = 5;
  }
  else {
    QString::toLower_helper((QString *)&local_50);
  }
  QVar4.m_size = (size_t)local_50.ptr;
  QVar4.field_0.m_data = aVar1.m_data;
  QXmlStreamWriter::writeStartElement(QVar4);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (lVar2 == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  pQVar3 = (this->m_signal).d.ptr;
  for (lVar2 = (this->m_signal).d.size * 0x18; lVar2 != 0; lVar2 = lVar2 + -0x18) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"signal",6);
    QVar7.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    QVar5.m_size = (size_t)local_50.ptr;
    QVar5.field_0.m_data = aVar1.m_data;
    QVar7.m_size = (size_t)(pQVar3->d).ptr;
    QXmlStreamWriter::writeTextElement(QVar5,QVar7);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    pQVar3 = pQVar3 + 1;
  }
  pQVar3 = (this->m_slot).d.ptr;
  for (lVar2 = (this->m_slot).d.size * 0x18; lVar2 != 0; lVar2 = lVar2 + -0x18) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"slot",4);
    QVar8.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    QVar6.m_size = (size_t)local_50.ptr;
    QVar6.field_0.m_data = aVar1.m_data;
    QVar8.m_size = (size_t)(pQVar3->d).ptr;
    QXmlStreamWriter::writeTextElement(QVar6,QVar8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    pQVar3 = pQVar3 + 1;
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomSlots::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("slots") : tagName.toLower());

    for (const QString &v : m_signal)
        writer.writeTextElement(u"signal"_s, v);

    for (const QString &v : m_slot)
        writer.writeTextElement(u"slot"_s, v);

    writer.writeEndElement();
}